

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

type __thiscall obs::signal<int(int)>::operator()(signal<int(int)> *this,int *args)

{
  bool bVar1;
  slot<int_(int)> *this_00;
  slot<int_(int)> *slot;
  undefined1 local_78 [8];
  iterator __end0;
  iterator __begin0;
  slot_list *__range3;
  int result;
  int *args_local;
  signal<int_(int)> *this_local;
  
  __range3._4_4_ = 0;
  safe_list<obs::slot<int_(int)>_>::begin
            ((iterator *)&__end0.m_next_iterator,(safe_list<obs::slot<int_(int)>_> *)(this + 8));
  safe_list<obs::slot<int_(int)>_>::end
            ((iterator *)local_78,(safe_list<obs::slot<int_(int)>_> *)(this + 8));
  while( true ) {
    bVar1 = safe_list<obs::slot<int_(int)>_>::iterator::operator!=
                      ((iterator *)&__end0.m_next_iterator,(iterator *)local_78);
    if (!bVar1) break;
    this_00 = safe_list<obs::slot<int_(int)>_>::iterator::operator*
                        ((iterator *)&__end0.m_next_iterator);
    if (this_00 != (slot<int_(int)> *)0x0) {
      __range3._4_4_ = slot<int(int)>::operator()((slot<int(int)> *)this_00,args);
    }
    safe_list<obs::slot<int_(int)>_>::iterator::operator++((iterator *)&__end0.m_next_iterator);
  }
  safe_list<obs::slot<int_(int)>_>::iterator::~iterator((iterator *)local_78);
  safe_list<obs::slot<int_(int)>_>::iterator::~iterator((iterator *)&__end0.m_next_iterator);
  return __range3._4_4_;
}

Assistant:

typename std::enable_if<!std::is_void<R>::value, R>::type
  operator()(Args2&&...args) {
    R result = R();
    for (auto slot : m_slots)
      if (slot)
        result = (*slot)(std::forward<Args2>(args)...);
    return result;
  }